

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool tdefl_output_buffer_putter(void *pBuf,int len,void *pUser)

{
  void *dst;
  long *in_RDX;
  int in_ESI;
  mz_uint8 *pNew_buf;
  size_t new_capacity;
  size_t new_size;
  tdefl_output_buffer *p;
  void *local_48;
  void *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  
  dst = (void *)(*in_RDX + (long)in_ESI);
  if ((void *)in_RDX[1] < dst) {
    local_48 = (void *)in_RDX[1];
    if ((int)in_RDX[3] == 0) {
      return 0;
    }
    do {
      if ((ulong)((long)local_48 * 2) < 0x80) {
        local_48 = (void *)0x80;
      }
      else {
        local_48 = (void *)((long)local_48 << 1);
      }
    } while (local_48 < dst);
    in_stack_ffffffffffffffc0 = realloc((void *)in_RDX[2],(size_t)local_48);
    if (in_stack_ffffffffffffffc0 == (void *)0x0) {
      return 0;
    }
    in_RDX[2] = (long)in_stack_ffffffffffffffc0;
    in_RDX[1] = (long)local_48;
    in_stack_ffffffffffffffc8 = local_48;
  }
  __wrap_memcpy(dst,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  *in_RDX = (long)dst;
  return 1;
}

Assistant:

static mz_bool tdefl_output_buffer_putter(const void *pBuf, int len, void *pUser)
{
  tdefl_output_buffer *p = (tdefl_output_buffer *)pUser;
  size_t new_size = p->m_size + len;
  if (new_size > p->m_capacity)
  {
    size_t new_capacity = p->m_capacity; mz_uint8 *pNew_buf; if (!p->m_expandable) return MZ_FALSE;
    do { new_capacity = MZ_MAX(128U, new_capacity << 1U); } while (new_size > new_capacity);
    pNew_buf = (mz_uint8*)MZ_REALLOC(p->m_pBuf, new_capacity); if (!pNew_buf) return MZ_FALSE;
    p->m_pBuf = pNew_buf; p->m_capacity = new_capacity;
  }
  memcpy((mz_uint8*)p->m_pBuf + p->m_size, pBuf, len); p->m_size = new_size;
  return MZ_TRUE;
}